

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O3

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  void *pvVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  void *pvVar19;
  int iVar20;
  int iVar21;
  uint _w;
  int iVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  void *pvVar26;
  int kj;
  int iVar27;
  long lVar28;
  ulong uVar29;
  int k;
  ulong uVar30;
  float fVar31;
  vector<int,_std::allocator<int>_> _space_ofs;
  int local_14c;
  void *local_148;
  void *local_140;
  void *local_130;
  void *local_128;
  ulong local_f0;
  allocator_type local_d9;
  ulong local_d8;
  ulong local_d0;
  long local_c8;
  ulong local_c0;
  ulong local_b8;
  void *local_b0;
  Mat local_a8;
  long local_60;
  void *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar2 = bottom_blob->w;
  iVar3 = bottom_blob->h;
  uVar4 = bottom_blob->c;
  uVar29 = (ulong)uVar4;
  sVar5 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_a8.cstep = 0;
      local_a8.data = (void *)0x0;
      local_a8.refcount._0_4_ = 0;
      local_a8.refcount._4_4_ = 0;
      local_a8.elemsize._0_4_ = 0;
      local_a8.elemsize._4_4_ = 0;
      local_a8.elempack = 0;
      local_a8.allocator = (Allocator *)0x0;
      local_a8.dims = 0;
      local_a8.w = 0;
      local_a8.h = 0;
      local_a8.d = 0;
      local_a8.c = 0;
      make_padding(this,bottom_blob,&local_a8,opt);
      iVar3 = local_a8.h;
      iVar2 = local_a8.w;
      iVar20 = -100;
      if ((local_a8.data != (void *)0x0) && ((long)local_a8.c * local_a8.cstep != 0)) {
        iVar21 = (local_a8.w - this->kernel_w) / this->stride_w;
        uVar24 = (long)(local_a8.h - this->kernel_h) / (long)this->stride_h;
        local_d8 = uVar24 & 0xffffffff;
        _w = iVar21 + 1;
        uVar12 = (int)uVar24 + 1;
        Mat::create(top_blob,_w,uVar12,uVar4,sVar5,opt->blob_allocator);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar24 = (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar24,&local_d9);
          iVar20 = this->kernel_h;
          if (0 < iVar20) {
            iVar10 = this->kernel_w;
            iVar13 = iVar2 - iVar10;
            iVar11 = 0;
            iVar23 = 0;
            iVar22 = 0;
            do {
              if (0 < iVar10) {
                lVar14 = 0;
                do {
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar22 + lVar14] = iVar23 + (int)lVar14;
                  iVar10 = this->kernel_w;
                  lVar14 = lVar14 + 1;
                  iVar27 = (int)lVar14;
                } while (iVar27 < iVar10);
                iVar22 = iVar22 + iVar27;
                iVar20 = this->kernel_h;
                iVar23 = iVar23 + iVar27;
              }
              iVar23 = iVar23 + iVar13;
              iVar11 = iVar11 + 1;
            } while (iVar11 < iVar20);
          }
          iVar20 = (int)uVar24;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              iVar20 = 0;
              local_14c = 0;
              if (this->pad_mode == 0) {
                iVar20 = (bottom_blob->w - local_a8.w) + this->pad_left + this->pad_right;
                local_14c = (bottom_blob->h - local_a8.h) + this->pad_top + this->pad_bottom;
              }
              if (0 < (int)uVar4) {
                local_b0 = local_a8.data;
                local_58 = top_blob->data;
                local_60 = top_blob->cstep * top_blob->elemsize;
                iVar10 = this->stride_h;
                local_d0 = (ulong)(int)_w;
                local_c0 = (ulong)uVar12;
                local_50 = local_a8.cstep *
                           CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
                lVar14 = (long)local_a8.w *
                         CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
                local_c8 = lVar14 * iVar10;
                local_b8 = 0;
                do {
                  if (-1 < (int)local_d8) {
                    local_148 = (void *)(local_60 * local_b8 + (long)local_58);
                    iVar13 = this->stride_w;
                    uVar4 = this->kernel_h;
                    local_128 = local_b0;
                    local_f0 = 0;
                    do {
                      if (-1 < iVar21) {
                        iVar11 = this->pad_top;
                        lVar28 = 0;
                        uVar24 = 0;
                        pvVar19 = local_128;
                        do {
                          fVar31 = NAN;
                          if (0 < (int)uVar4) {
                            fVar31 = 0.0;
                            uVar25 = 0;
                            iVar23 = 0;
                            pvVar15 = pvVar19;
                            do {
                              lVar16 = uVar25 + local_f0 * (long)iVar10;
                              if (iVar11 <= lVar16) {
                                if ((local_14c + iVar3) - this->pad_bottom <= lVar16) break;
                                if (0 < this->kernel_w) {
                                  uVar17 = 0;
                                  do {
                                    if ((long)this->pad_left <= (long)(uVar17 + lVar28)) {
                                      if ((long)((iVar20 + iVar2) - this->pad_right) <=
                                          (long)(uVar17 + lVar28)) break;
                                      fVar31 = fVar31 + *(float *)((long)pvVar15 + uVar17 * 4);
                                      iVar23 = iVar23 + 1;
                                    }
                                    uVar17 = uVar17 + 1;
                                  } while ((uint)this->kernel_w != uVar17);
                                }
                              }
                              uVar25 = uVar25 + 1;
                              pvVar15 = (void *)((long)pvVar15 + lVar14);
                            } while (uVar25 != uVar4);
                            fVar31 = fVar31 / (float)iVar23;
                          }
                          *(float *)((long)local_148 + uVar24 * 4) = fVar31;
                          uVar24 = uVar24 + 1;
                          pvVar19 = (void *)((long)pvVar19 + (long)iVar13 * 4);
                          lVar28 = lVar28 + iVar13;
                        } while (uVar24 != _w);
                      }
                      local_148 = (void *)((long)local_148 + local_d0 * 4);
                      local_f0 = local_f0 + 1;
                      local_128 = (void *)((long)local_128 + local_c8);
                    } while (local_f0 != local_c0);
                  }
                  local_b8 = local_b8 + 1;
                  local_b0 = (void *)((long)local_b0 + local_50);
                } while (local_b8 != uVar29);
              }
            }
            else if (0 < (int)uVar4) {
              sVar5 = top_blob->cstep;
              sVar6 = top_blob->elemsize;
              pvVar19 = top_blob->data;
              local_140 = (void *)0x0;
              do {
                if (-1 < (int)local_d8) {
                  pvVar15 = (void *)(sVar5 * sVar6 * (long)local_140 + (long)pvVar19);
                  iVar2 = this->stride_h;
                  iVar3 = this->stride_w;
                  uVar25 = 0;
                  do {
                    if (-1 < iVar21) {
                      uVar17 = 0;
                      do {
                        if (iVar20 < 1) {
                          fVar31 = 0.0;
                        }
                        else {
                          fVar31 = 0.0;
                          uVar30 = 0;
                          do {
                            fVar31 = fVar31 + *(float *)((long)local_a8.data +
                                                        (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar30] *
                                                  4 + uVar17 * (long)iVar3 * 4 +
                                                      uVar25 * (long)iVar2 *
                                                               (long)local_a8.w *
                                                               CONCAT44(local_a8.elemsize._4_4_,
                                                                        (undefined4)
                                                                        local_a8.elemsize) +
                                                      local_a8.cstep *
                                                      CONCAT44(local_a8.elemsize._4_4_,
                                                               (undefined4)local_a8.elemsize) *
                                                      (long)local_140);
                            uVar30 = uVar30 + 1;
                          } while ((uVar24 & 0xffffffff) != uVar30);
                        }
                        *(float *)((long)pvVar15 + uVar17 * 4) = fVar31 * (1.0 / (float)iVar20);
                        uVar17 = uVar17 + 1;
                      } while (uVar17 != _w);
                    }
                    pvVar15 = (void *)((long)pvVar15 + (long)(int)_w * 4);
                    uVar25 = uVar25 + 1;
                  } while (uVar25 != uVar12);
                }
                local_140 = (void *)((long)local_140 + 1);
              } while (local_140 != (void *)uVar29);
            }
          }
          else if ((this->pooling_type == 0) && (0 < (int)uVar4)) {
            pvVar19 = top_blob->data;
            sVar5 = top_blob->cstep;
            sVar6 = top_blob->elemsize;
            local_140 = (void *)0x0;
            do {
              if (-1 < (int)local_d8) {
                pvVar15 = (void *)(sVar5 * sVar6 * (long)local_140 + (long)pvVar19);
                iVar2 = this->stride_h;
                iVar3 = this->stride_w;
                uVar25 = 0;
                do {
                  if (-1 < iVar21) {
                    lVar14 = uVar25 * (long)iVar2 *
                                      (long)local_a8.w *
                                      CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize
                                              ) +
                             local_a8.cstep *
                             CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize) *
                             (long)local_140;
                    uVar17 = 0;
                    do {
                      lVar28 = uVar17 * (long)iVar3;
                      fVar31 = *(float *)((long)local_a8.data + lVar28 * 4 + lVar14);
                      if (0 < iVar20) {
                        uVar30 = 0;
                        do {
                          fVar1 = *(float *)((long)local_a8.data +
                                            (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar30] *
                                            4 + lVar28 * 4 + lVar14);
                          if (fVar31 <= fVar1) {
                            fVar31 = fVar1;
                          }
                          uVar30 = uVar30 + 1;
                        } while ((uVar24 & 0xffffffff) != uVar30);
                      }
                      *(float *)((long)pvVar15 + uVar17 * 4) = fVar31;
                      uVar17 = uVar17 + 1;
                    } while (uVar17 != _w);
                  }
                  pvVar15 = (void *)((long)pvVar15 + (long)(int)_w * 4);
                  uVar25 = uVar25 + 1;
                } while (uVar25 != uVar12);
              }
              local_140 = (void *)((long)local_140 + 1);
            } while (local_140 != (void *)uVar29);
          }
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          iVar20 = 0;
        }
      }
      piVar9 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            if (local_a8.data != (void *)0x0) {
              free(local_a8.data);
            }
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      Mat::create(top_blob,this->out_w,this->out_h,uVar4,sVar5,opt->blob_allocator);
      pvVar19 = top_blob->data;
      iVar20 = -100;
      if ((pvVar19 != (void *)0x0) && (sVar5 = top_blob->cstep, (long)top_blob->c * sVar5 != 0)) {
        iVar20 = 0;
        if (this->pooling_type == 0) {
          if (0 < (int)uVar4) {
            pvVar15 = bottom_blob->data;
            lVar28 = bottom_blob->cstep * bottom_blob->elemsize;
            sVar6 = top_blob->elemsize;
            uVar4 = this->out_w;
            iVar21 = this->out_h;
            lVar14 = (long)iVar2 * 4;
            local_d0 = 0;
            local_128 = pvVar15;
            do {
              if (0 < iVar21) {
                local_140 = (void *)(sVar5 * sVar6 * local_d0 + (long)pvVar19);
                iVar20 = 0;
                do {
                  iVar10 = iVar20 + 1;
                  if (0 < (int)uVar4) {
                    iVar13 = (iVar10 * iVar3 + iVar21 + -1) / iVar21;
                    iVar20 = (iVar20 * iVar3) / iVar21;
                    uVar24 = 0;
                    do {
                      iVar11 = ((int)uVar24 * iVar2) / (int)uVar4;
                      uVar25 = uVar24 + 1;
                      fVar31 = *(float *)((long)pvVar15 +
                                         (long)(iVar11 + iVar20 * iVar2) * 4 + lVar28 * local_d0);
                      if (iVar20 < iVar13) {
                        iVar23 = (int)((int)uVar25 * iVar2 + (uVar4 - 1)) / (int)uVar4;
                        lVar16 = (long)iVar20;
                        pvVar26 = (void *)(lVar14 * iVar20 + (long)local_128);
                        do {
                          lVar18 = (long)iVar11;
                          if (iVar11 < iVar23) {
                            do {
                              fVar1 = *(float *)((long)pvVar26 + lVar18 * 4);
                              if (fVar31 <= fVar1) {
                                fVar31 = fVar1;
                              }
                              lVar18 = lVar18 + 1;
                            } while (iVar23 != lVar18);
                          }
                          lVar16 = lVar16 + 1;
                          pvVar26 = (void *)((long)pvVar26 + lVar14);
                        } while (lVar16 != iVar13);
                      }
                      *(float *)((long)local_140 + uVar24 * 4) = fVar31;
                      uVar24 = uVar25;
                    } while (uVar25 != uVar4);
                  }
                  local_140 = (void *)((long)local_140 + (long)(int)uVar4 * 4);
                  iVar20 = iVar10;
                } while (iVar10 != iVar21);
              }
              local_d0 = local_d0 + 1;
              local_128 = (void *)((long)local_128 + lVar28);
              iVar20 = 0;
            } while (local_d0 != uVar29);
          }
        }
        else if ((this->pooling_type == 1) && (0 < (int)uVar4)) {
          local_130 = bottom_blob->data;
          sVar6 = bottom_blob->cstep;
          sVar7 = top_blob->elemsize;
          uVar4 = this->out_w;
          iVar21 = this->out_h;
          sVar8 = bottom_blob->elemsize;
          lVar14 = (long)iVar2 * 4;
          local_128 = (void *)0x0;
          do {
            if (0 < iVar21) {
              pvVar15 = (void *)(sVar5 * sVar7 * (long)local_128 + (long)pvVar19);
              iVar20 = 0;
              do {
                iVar10 = iVar20 + 1;
                if (0 < (int)uVar4) {
                  iVar13 = (iVar10 * iVar3 + iVar21 + -1) / iVar21;
                  iVar20 = (iVar20 * iVar3) / iVar21;
                  uVar24 = 0;
                  do {
                    iVar23 = ((int)uVar24 * iVar2) / (int)uVar4;
                    uVar25 = uVar24 + 1;
                    iVar11 = (int)((int)uVar25 * iVar2 + (uVar4 - 1)) / (int)uVar4;
                    fVar31 = 0.0;
                    if (iVar20 < iVar13) {
                      pvVar26 = (void *)(lVar14 * iVar20 + (long)local_130);
                      lVar28 = (long)iVar20;
                      do {
                        lVar16 = (long)iVar23;
                        if (iVar23 < iVar11) {
                          do {
                            fVar31 = fVar31 + *(float *)((long)pvVar26 + lVar16 * 4);
                            lVar16 = lVar16 + 1;
                          } while (iVar11 != lVar16);
                        }
                        lVar28 = lVar28 + 1;
                        pvVar26 = (void *)((long)pvVar26 + lVar14);
                      } while (lVar28 != iVar13);
                    }
                    *(float *)((long)pvVar15 + uVar24 * 4) =
                         fVar31 / ((float)(iVar11 - iVar23) * (float)(iVar13 - iVar20));
                    uVar24 = uVar25;
                  } while (uVar25 != uVar4);
                }
                pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar4 * 4);
                iVar20 = iVar10;
              } while (iVar10 != iVar21);
            }
            local_128 = (void *)((long)local_128 + 1);
            local_130 = (void *)((long)local_130 + sVar6 * sVar8);
            iVar20 = 0;
          } while (local_128 != (void *)uVar29);
        }
      }
    }
  }
  else {
    Mat::create(top_blob,uVar4,sVar5,opt->blob_allocator);
    pvVar19 = top_blob->data;
    iVar20 = -100;
    if ((pvVar19 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar12 = iVar3 * iVar2;
      if (this->pooling_type == 0) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        lVar14 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar15 = bottom_blob->data;
        uVar24 = 0;
        pvVar26 = pvVar15;
        do {
          fVar31 = *(float *)((long)pvVar15 + lVar14 * uVar24);
          if (0 < (int)uVar12) {
            uVar25 = 0;
            do {
              fVar1 = *(float *)((long)pvVar26 + uVar25 * 4);
              if (fVar31 <= fVar1) {
                fVar31 = fVar1;
              }
              uVar25 = uVar25 + 1;
            } while (uVar12 != uVar25);
          }
          *(float *)((long)pvVar19 + uVar24 * 4) = fVar31;
          uVar24 = uVar24 + 1;
          pvVar26 = (void *)((long)pvVar26 + lVar14);
        } while (uVar24 != uVar29);
      }
      else {
        if (this->pooling_type != 1) {
          return 0;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        sVar5 = bottom_blob->cstep;
        sVar6 = bottom_blob->elemsize;
        pvVar15 = bottom_blob->data;
        uVar24 = 0;
        do {
          if ((int)uVar12 < 1) {
            fVar31 = 0.0;
          }
          else {
            fVar31 = 0.0;
            uVar25 = 0;
            do {
              fVar31 = fVar31 + *(float *)((long)pvVar15 + uVar25 * 4);
              uVar25 = uVar25 + 1;
            } while (uVar12 != uVar25);
          }
          *(float *)((long)pvVar19 + uVar24 * 4) = fVar31 * (1.0 / (float)(int)uVar12);
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar5 * sVar6);
        } while (uVar24 != uVar29);
      }
      iVar20 = 0;
    }
  }
  return iVar20;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                    for (int j = 0; j < out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                        float max = inptr[ih0 * w + iw0];
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                max = std::max(max, inptr[ih * w + iw]);
                            }
                        }

                        outptr[j] = max;
                    }
                    outptr += out_w;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                    const int hk = ih1 - ih0;
                    for (int j = 0; j < out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                        const int wk = iw1 - iw0;

                        float sum = 0;
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                sum += inptr[ih * w + iw];
                            }
                        }

                        outptr[j] = sum / hk / wk;
                    }

                    outptr += out_w;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}